

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,QString *string)

{
  long lVar1;
  QStringView string_00;
  QTextStreamPrivate *this_00;
  storage_type_conflict *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  QStringView *pQVar2;
  QStringView *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  this_00 = d_func((QTextStream *)0x135aef);
  if ((this_00->string != (QString *)0x0) ||
     (local_40 = in_RDI, this_00->device != (QIODevice *)0x0)) {
    QStringView::QStringView<QString,_true>(in_RDI,(QString *)this_00);
    string_00.m_size = (qsizetype)pQVar2;
    string_00.m_data = in_RSI;
    QTextStreamPrivate::putString(this_00,string_00,SUB81((ulong)in_RDI >> 0x38,0));
    local_40 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QTextStream *)local_40;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(const QString &string)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putString(string);
    return *this;
}